

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_tracer.cc
# Opt level: O3

bool rtc::tracing::StartInternalCapture(char *filename)

{
  FILE *file;
  size_t sVar1;
  LogMessage local_1d8;
  
  file = fopen(filename,"w");
  if (file == (FILE *)0x0) {
    if (LogMessage::min_sev_ < 5) {
      LogMessage::LogMessage
                (&local_1d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/event_tracer.cc"
                 ,0xfa,LERROR,ERRCTX_NONE,0,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1d8,"Failed to open trace file \'",0x1b);
      if (filename == (char *)0x0) {
        std::ios::clear((int)&stack0xfffffffffffffe18 +
                        (int)*(undefined8 *)(local_1d8._0_8_ + -0x18) + 0x10);
      }
      else {
        sVar1 = strlen(filename);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1d8,filename,sVar1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1d8,"\' for writing.",0xe);
      LogMessage::~LogMessage(&local_1d8);
    }
  }
  else {
    anon_unknown_0::EventLogger::Start((anonymous_namespace)::g_event_logger,(FILE *)file,true);
  }
  return file != (FILE *)0x0;
}

Assistant:

bool StartInternalCapture(const char* filename) {
  FILE* file = fopen(filename, "w");
  if (!file) {
    LOG(LS_ERROR) << "Failed to open trace file '" << filename
                  << "' for writing.";
    return false;
  }
  g_event_logger->Start(file, true);
  return true;
}